

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var.c
# Opt level: O3

void varcleanup(GlobalConfig *global)

{
  tool_var *ptVar1;
  tool_var *__ptr;
  tool_var *t;
  
  __ptr = global->variables;
  while (__ptr != (tool_var *)0x0) {
    ptVar1 = __ptr->next;
    free(__ptr->content);
    free(__ptr);
    __ptr = ptVar1;
  }
  return;
}

Assistant:

void varcleanup(struct GlobalConfig *global)
{
  struct tool_var *list = global->variables;
  while(list) {
    struct tool_var *t = list;
    list = list->next;
    free(CURL_UNCONST(t->content));
    free(t);
  }
}